

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  OneofDescriptor *pOVar1;
  pointer ppFVar2;
  MessageSCCAnalyzer *this_00;
  long lVar3;
  bool bVar4;
  CppType CVar5;
  FieldGenerator *pFVar6;
  Descriptor *descriptor;
  long lVar7;
  pointer ppFVar8;
  FieldDescriptor *this_01;
  Iterator __end4;
  Iterator __begin3;
  Formatter format;
  Iterator __begin4;
  Iterator __end4_1;
  Iterator __end3;
  
  bVar4 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar4) {
    format.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>(&format,"bool $classname$::IsInitialized() const {\n");
    io::Printer::Indent(format.printer_);
    if (0 < *(int *)(this->descriptor_ + 0x78)) {
      Formatter::operator()<>
                (&format,"if (!_extensions_.IsInitialized()) {\n  return false;\n}\n\n");
    }
    if (0 < this->num_required_fields_) {
      Formatter::operator()<>
                (&format,"if (_Internal::MissingRequiredFields(_has_bits_)) return false;\n");
    }
    ppFVar2 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar8 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar2;
        ppFVar8 = ppFVar8 + 1) {
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar8);
      (*pFVar6->_vptr_FieldGenerator[0x15])(pFVar6,printer);
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>(&format,"if (!_weak_field_map_.IsInitialized()) return false;\n");
    }
    __begin3.descriptor = this->descriptor_;
    __begin3.idx = 0;
    __end3.idx = *(int *)(__begin3.descriptor + 0x6c);
    __end3.descriptor = __begin3.descriptor;
    while( true ) {
      bVar4 = operator!=(&__begin3,&__end3);
      if (!bVar4) break;
      pOVar1 = (OneofDescriptor *)
               (*(long *)(__begin3.descriptor + 0x30) + (long)__begin3.idx * 0x28);
      __begin4.idx = 0;
      __end4.idx = *(int *)(*(long *)(__begin3.descriptor + 0x30) + 4 + (long)__begin3.idx * 0x28);
      __end4.descriptor = pOVar1;
      __begin4.descriptor = pOVar1;
LAB_002dca8e:
      bVar4 = operator!=(&__begin4,&__end4);
      if (!bVar4) goto LAB_002dcc2f;
      this_01 = (FieldDescriptor *)
                ((long)__begin4.idx * 0x48 + *(long *)(__begin4.descriptor + 0x20));
      CVar5 = FieldDescriptor::cpp_type(this_01);
      if (CVar5 != CPPTYPE_MESSAGE) {
LAB_002dcaf5:
        __begin4.idx = __begin4.idx + 1;
        goto LAB_002dca8e;
      }
      bVar4 = IsLazilyVerifiedLazy(this_01,&this->options_);
      if (bVar4) goto LAB_002dcaf5;
      this_00 = this->scc_analyzer_;
      descriptor = FieldDescriptor::message_type(this_01);
      bVar4 = MessageSCCAnalyzer::HasRequiredFields(this_00,descriptor);
      if (!bVar4) goto LAB_002dcaf5;
      Formatter::operator()
                (&format,"switch ($1$_case()) {\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar1 + 8)
                );
      io::Printer::Indent(format.printer_);
      __end4.idx = 0;
      __end4_1.idx = *(int *)(pOVar1 + 4);
      __end4.descriptor = pOVar1;
      __end4_1.descriptor = pOVar1;
      while( true ) {
        bVar4 = operator!=(&__end4,&__end4_1);
        if (!bVar4) break;
        lVar7 = (long)__end4.idx;
        lVar3 = *(long *)(__end4.descriptor + 0x20);
        UnderscoresToCamelCase((string *)&__begin4,*(string **)(lVar3 + 8 + lVar7 * 0x48),true);
        Formatter::operator()(&format,"case k$1$: {\n",(string *)&__begin4);
        std::__cxx11::string::~string((string *)&__begin4);
        io::Printer::Indent(format.printer_);
        pFVar6 = FieldGeneratorMap::get
                           (&this->field_generators_,(FieldDescriptor *)(lVar3 + lVar7 * 0x48));
        (*pFVar6->_vptr_FieldGenerator[0x15])(pFVar6,printer);
        Formatter::operator()<>(&format,"break;\n");
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>(&format,"}\n");
        __end4.idx = __end4.idx + 1;
      }
      ToUpper((string *)&__begin4,*(string **)(pOVar1 + 8));
      Formatter::operator()(&format,"case $1$_NOT_SET: {\n  break;\n}\n",(string *)&__begin4);
      std::__cxx11::string::~string((string *)&__begin4);
      io::Printer::Outdent(format.printer_);
      Formatter::operator()<>(&format,"}\n");
LAB_002dcc2f:
      __begin3.idx = __begin3.idx + 1;
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"  return true;\n}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&format.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);
  format("bool $classname$::IsInitialized() const {\n");
  format.Indent();

  if (descriptor_->extension_range_count() > 0) {
    format(
        "if (!_extensions_.IsInitialized()) {\n"
        "  return false;\n"
        "}\n\n");
  }

  if (num_required_fields_ > 0) {
    format(
        "if (_Internal::MissingRequiredFields(_has_bits_))"
        " return false;\n");
  }

  // Now check that all non-oneof embedded messages are initialized.
  for (auto field : optimized_order_) {
    field_generators_.get(field).GenerateIsInitialized(printer);
  }
  if (num_weak_fields_) {
    // For Weak fields.
    format("if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  // Go through the oneof fields, emitting a switch if any might have required
  // fields.
  for (auto oneof : OneOfRange(descriptor_)) {
    bool has_required_fields = false;
    for (auto field : FieldRange(oneof)) {
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        has_required_fields = true;
        break;
      }
    }

    if (!has_required_fields) {
      continue;
    }

    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateIsInitialized(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  format.Outdent();
  format(
      "  return true;\n"
      "}\n");
}